

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastCallback.cpp
# Opt level: O1

void __thiscall
btTriangleConvexcastCallback::btTriangleConvexcastCallback
          (btTriangleConvexcastCallback *this,btConvexShape *convexShape,
          btTransform *convexShapeFrom,btTransform *convexShapeTo,btTransform *triangleToWorld,
          btScalar triangleCollisionMargin)

{
  undefined8 uVar1;
  
  (this->super_btTriangleCallback)._vptr_btTriangleCallback =
       (_func_int **)&PTR__btTriangleCallback_00227c58;
  this->m_convexShape = convexShape;
  uVar1 = *(undefined8 *)((convexShapeFrom->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeFrom).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexShapeFrom->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexShapeFrom).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeFrom->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeFrom).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexShapeFrom->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexShapeFrom).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeFrom->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeFrom).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexShapeFrom->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexShapeFrom).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeFrom->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexShapeFrom).m_origin.m_floats =
       *(undefined8 *)(convexShapeFrom->m_origin).m_floats;
  *(undefined8 *)((this->m_convexShapeFrom).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeTo->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeTo).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexShapeTo->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexShapeTo).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeTo->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeTo).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexShapeTo->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexShapeTo).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeTo->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeTo).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexShapeTo->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexShapeTo).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeTo->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexShapeTo).m_origin.m_floats =
       *(undefined8 *)(convexShapeTo->m_origin).m_floats;
  *(undefined8 *)((this->m_convexShapeTo).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((triangleToWorld->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_triangleToWorld).m_basis.m_el[0].m_floats =
       *(undefined8 *)(triangleToWorld->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_triangleToWorld).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((triangleToWorld->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_triangleToWorld).m_basis.m_el[1].m_floats =
       *(undefined8 *)(triangleToWorld->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_triangleToWorld).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((triangleToWorld->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_triangleToWorld).m_basis.m_el[2].m_floats =
       *(undefined8 *)(triangleToWorld->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_triangleToWorld).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((triangleToWorld->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_triangleToWorld).m_origin.m_floats =
       *(undefined8 *)(triangleToWorld->m_origin).m_floats;
  *(undefined8 *)((this->m_triangleToWorld).m_origin.m_floats + 2) = uVar1;
  this->m_hitFraction = 1.0;
  this->m_triangleCollisionMargin = triangleCollisionMargin;
  this->m_allowedPenetration = 0.0;
  return;
}

Assistant:

btTriangleConvexcastCallback::btTriangleConvexcastCallback (const btConvexShape* convexShape, const btTransform& convexShapeFrom, const btTransform& convexShapeTo, const btTransform& triangleToWorld, const btScalar triangleCollisionMargin)
{
	m_convexShape = convexShape;
	m_convexShapeFrom = convexShapeFrom;
	m_convexShapeTo = convexShapeTo;
	m_triangleToWorld = triangleToWorld;
	m_hitFraction = 1.0f;
	m_triangleCollisionMargin = triangleCollisionMargin;
	m_allowedPenetration = 0.f;
}